

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgm_tree_index_impl.h
# Opt level: O2

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
ted_ub::LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::
fill_gaps_in_mapping
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,
          LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this,
          TreeIndexLGM *t1,TreeIndexLGM *t2,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *mapping,int k)

{
  longlong *plVar1;
  pointer *pppVar2;
  int iVar3;
  pointer piVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  pointer ppVar9;
  long lVar10;
  long lVar11;
  int x;
  int y;
  ulong uVar12;
  pair<int,_int> end_gap;
  int local_e4;
  ulong local_d8;
  vector<int,_std::allocator<int>_> t2_count_mapped_desc;
  vector<int,_std::allocator<int>_> t1_count_mapped_desc;
  pair<int,_int> local_68;
  vector<int,_std::allocator<int>_> t2_count_mapped_anc;
  vector<int,_std::allocator<int>_> t1_count_mapped_anc;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&t1_count_mapped_desc,(long)(t1->super_Constants).tree_size_,
             (allocator_type *)&t2_count_mapped_desc);
  std::vector<int,_std::allocator<int>_>::vector
            (&t2_count_mapped_desc,(long)(t2->super_Constants).tree_size_,
             (allocator_type *)&t1_count_mapped_anc);
  std::vector<int,_std::allocator<int>_>::vector
            (&t1_count_mapped_anc,(long)(t1->super_Constants).tree_size_,
             (allocator_type *)&t2_count_mapped_anc);
  std::vector<int,_std::allocator<int>_>::vector
            (&t2_count_mapped_anc,(long)(t2->super_Constants).tree_size_,(allocator_type *)&end_gap)
  ;
  get_mapped_ancestors_counts(this,t1,t2,mapping,&t1_count_mapped_anc,&t2_count_mapped_anc);
  end_gap.second = (t2->super_Constants).tree_size_;
  end_gap.first = (t1->super_Constants).tree_size_;
  std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
  emplace_back<std::pair<int,int>>
            ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)mapping,&end_gap);
  end_gap.first = 0;
  end_gap.second = 0;
  ppVar9 = (mapping->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8 = 0xffffffffffffffff;
  local_e4 = -1;
LAB_00107ac3:
  do {
    if (ppVar9 == (mapping->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
      pppVar2 = &(__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *pppVar2 = *pppVar2 + -1;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&t2_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&t1_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>);
      return __return_storage_ptr__;
    }
    iVar3 = ppVar9->first;
    iVar6 = ppVar9->second;
    end_gap = *ppVar9;
    if ((iVar3 - local_e4 == 1) || (iVar6 - (int)local_d8 == 1)) {
      piVar4 = (t1->super_PostLToParent).postl_to_parent_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar7 = (long)local_e4;
LAB_00107c79:
      lVar10 = (long)iVar3;
      lVar11 = (long)(t1->super_Constants).tree_size_ + -1;
LAB_00107c82:
      lVar7 = lVar7 + 1;
      if (lVar7 < lVar10) break;
      if (iVar3 < (int)lVar11) {
        iVar3 = (t1->super_PostLToParent).postl_to_parent_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar10];
        t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar3] =
             t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar10] +
             t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar3] + 1;
      }
      piVar4 = (t2->super_PostLToParent).postl_to_parent_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar7 = (long)(int)local_d8;
      while( true ) {
        lVar7 = lVar7 + 1;
        lVar10 = (long)iVar6;
        lVar11 = (long)(t2->super_Constants).tree_size_ + -1;
        if (lVar10 <= lVar7) break;
        if (lVar7 < lVar11) {
          t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[piVar4[lVar7]] =
               t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[piVar4[lVar7]] +
               t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
        }
      }
      if (iVar6 < (int)lVar11) {
        iVar3 = (t2->super_PostLToParent).postl_to_parent_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar10];
        t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar3] =
             t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar10] +
             t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar3] + 1;
      }
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (__return_storage_ptr__,&end_gap);
      goto LAB_00107ded;
    }
    uVar12 = (ulong)((int)local_d8 + 1);
    x = local_e4;
LAB_00107b25:
    x = x + 1;
    for (uVar12 = (ulong)(int)uVar12; (y = (int)uVar12, x < iVar3 && (y < iVar6));
        uVar12 = uVar12 + 1) {
      plVar1 = &(this->
                super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>
                ).subproblem_counter_;
      *plVar1 = *plVar1 + 1;
      if ((t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[x] ==
           t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar12]) &&
         (t1_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[x] ==
          t2_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12])) {
        bVar5 = k_relevant(this,t1,t2,x,y,k);
        if (bVar5) {
          bVar5 = if_in_corresponding_regions
                            (this,t1,t2,local_e4,x,end_gap.first,(int)local_d8,y,end_gap.second);
          if (bVar5) {
            if (x < (t1->super_Constants).tree_size_ + -1) {
              iVar3 = (t1->super_PostLToParent).postl_to_parent_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[x];
              t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3] =
                   t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[x] +
                   t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3] + 1;
            }
            if (y < (t2->super_Constants).tree_size_ + -1) {
              iVar3 = (t2->super_PostLToParent).postl_to_parent_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[uVar12];
              t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3] =
                   t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12] +
                   t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3] + 1;
            }
            local_68.first = x;
            local_68.second = y;
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                       __return_storage_ptr__,&local_68);
            local_e4 = x;
            local_d8 = uVar12;
            goto LAB_00107ac3;
          }
        }
      }
      if (x - iVar3 < y - iVar6) goto LAB_00107c3b;
      if (y < (t2->super_Constants).tree_size_ + -1) {
        t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start
        [(t2->super_PostLToParent).postl_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar12]] =
             t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start
             [(t2->super_PostLToParent).postl_to_parent_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar12]] +
             t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
      }
    }
    piVar4 = (t2->super_PostLToParent).postl_to_parent_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    for (uVar8 = uVar12 & 0xffffffff; (int)uVar8 < iVar6; uVar8 = (ulong)((int)uVar8 + 1)) {
      if (y < (t2->super_Constants).tree_size_ + -1) {
        t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[piVar4[uVar12]] =
             t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[piVar4[uVar12]] +
             t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
      }
    }
    piVar4 = (t1->super_PostLToParent).postl_to_parent_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    for (iVar6 = x; iVar6 < iVar3; iVar6 = iVar6 + 1) {
      if (x < (t1->super_Constants).tree_size_ + -1) {
        t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[piVar4[x]] =
             t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[piVar4[x]] +
             t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[x];
      }
    }
    if (end_gap.first < (t1->super_Constants).tree_size_ + -1) {
      iVar3 = (t1->super_PostLToParent).postl_to_parent_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [end_gap.first];
      t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar3] =
           t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[end_gap.first] +
           t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[iVar3] + 1;
    }
    if (end_gap.second < (t2->super_Constants).tree_size_ + -1) {
      iVar3 = (t2->super_PostLToParent).postl_to_parent_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [end_gap.second];
      t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar3] =
           t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[end_gap.second] +
           t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[iVar3] + 1;
    }
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              (__return_storage_ptr__,&end_gap);
LAB_00107ded:
    local_e4 = end_gap.first;
    local_d8 = (ulong)end_gap >> 0x20;
    ppVar9 = ppVar9 + 1;
  } while( true );
  if (lVar7 < lVar11) goto code_r0x00107c8f;
  goto LAB_00107c82;
code_r0x00107c8f:
  t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start[piVar4[lVar7]] =
       t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[piVar4[lVar7]] +
       t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar7];
  goto LAB_00107c79;
LAB_00107c3b:
  if (x < (t1->super_Constants).tree_size_ + -1) {
    t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start
    [(t1->super_PostLToParent).postl_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
     _M_impl.super__Vector_impl_data._M_start[x]] =
         t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start
         [(t1->super_PostLToParent).postl_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[x]] +
         t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[x];
  }
  goto LAB_00107b25;
}

Assistant:

std::vector<std::pair<int, int>> LGMTreeIndex<CostModel, TreeIndex>::fill_gaps_in_mapping(
    const TreeIndex& t1, const TreeIndex& t2,
    std::vector<std::pair<int, int>>& mapping, const int k) {
  
  // In result_mapping we store the output of this function.
  std::vector<std::pair<int, int>> result_mapping;
  
  // The counts for mapped descendants and nodes to the left must be maintained.
  std::vector<int> t1_count_mapped_desc(t1.tree_size_);
  std::vector<int> t2_count_mapped_desc(t2.tree_size_);
    
  // The counts for mapped ancestors.
  std::vector<int> t1_count_mapped_anc(t1.tree_size_);
  std::vector<int> t2_count_mapped_anc(t2.tree_size_);
  get_mapped_ancestors_counts(t1, t2, mapping, t1_count_mapped_anc, t2_count_mapped_anc);
  
  // Add a dummy mapping pair to cover the gap from the last mapping until the
  // ends of the trees.
  mapping.push_back({t1.tree_size_, t2.tree_size_});
  
  std::pair<int, int> begin_gap = {-1, -1};
  std::pair<int, int> end_gap;
  std::vector<std::pair<int, int>>::iterator end_gap_it = mapping.begin();
  
  while (end_gap_it != mapping.end()) {
    end_gap = *end_gap_it;
    // If there is no gap, continue with the next mapped pair.
    if (end_gap.first - begin_gap.first == 1 || end_gap.second - begin_gap.second == 1) {
      // Update the counts for nodes between begin_gap and end_gap, if any,
      // as not-mapped nodes.
      for (int not_mapped_first = begin_gap.first + 1; not_mapped_first < end_gap.first; ++not_mapped_first) {
        update_desc_when_not_mapped(not_mapped_first, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
      }
      // Update the counts for nodes in end_gap as mapped nodes.
      update_desc_when_mapped(end_gap.first, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
      // Update the counts for nodes between begin_gap and end_gap, if any,
      // as not-mapped nodes.
      for (int not_mapped_second = begin_gap.second + 1; not_mapped_second < end_gap.second; ++not_mapped_second) {
        update_desc_when_not_mapped(not_mapped_second, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
      }
      // Update the counts for nodes in end_gap as mapped nodes.
      update_desc_when_mapped(end_gap.second, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
      // Push the end of the current gap to the result.
      result_mapping.push_back(end_gap);
      // Update the begin of the next gap.
      begin_gap = end_gap;
      ++end_gap_it;
      continue;
    }
    // There is a gap --> try to map nodes --> at the first node pair mapped,
    // change the gap and continue the loop.
    int i = begin_gap.first + 1;
    int i_last = end_gap.first - 1;
    int j = begin_gap.second + 1;
    int j_last = end_gap.second - 1;
    bool mapped_in_gap = false;
    while (i <= i_last && j <= j_last) {
      ++subproblem_counter_;
      if (t1_count_mapped_desc[i] == t2_count_mapped_desc[j] &&
          t1_count_mapped_anc[i] == t2_count_mapped_anc[j] &&
          k_relevant(t1, t2, i, j, k) &&
          if_in_corresponding_regions(t1, t2, begin_gap.first, i, end_gap.first, begin_gap.second, j, end_gap.second)) {
        // Map (i,j) + push to result mapping + update counts for both nodes
        // incremented as mapped.
        update_desc_when_mapped(i, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
        update_desc_when_mapped(j, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
        result_mapping.push_back({i, j});
        begin_gap = {i, j};
        mapped_in_gap = true;
        break;
      } else {
        // Update counts for the incremented node as non-mapped.
        if (i_last - i > j_last - j) {
          update_desc_when_not_mapped(i, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
          ++i;
        } else {
          update_desc_when_not_mapped(j, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
          ++j;
        }
      }
    }
    if (mapped_in_gap) {
      continue;
    } else {
      // Check the case when only one of i or j incremented beyond the limit.
      // The gap in one of the trees has been used up.
      // Nothing mapped in the gap.
      for (int j_missing = j; j_missing <= j_last; ++j_missing) {
        update_desc_when_not_mapped(j, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
      }
      for (int i_missing = i; i_missing <= i_last; ++i_missing) {
        update_desc_when_not_mapped(i, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
      }
      // Update the counts for nodes in end_gap as mapped nodes.
      update_desc_when_mapped(end_gap.first, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
      update_desc_when_mapped(end_gap.second, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
      // Push the end of the current gap to the result.
      result_mapping.push_back(end_gap);
      // Update the begin of the next gap.
      begin_gap = end_gap;
      ++end_gap_it;
      continue;
    }
  }
  // Remove the last dummy mapping.
  result_mapping.pop_back();
  return result_mapping;
}